

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
SimpleDictionaryTypeHandlerBase
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this,
          Recycler *recycler)

{
  Type *addr;
  int capacity;
  Recycler *alloc;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  DynamicTypeHandler::DynamicTypeHandler(&this->super_DynamicTypeHandler,1,0,0,'\x01');
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_0153d228
  ;
  addr = &this->propertyMap;
  (this->propertyMap).ptr =
       (BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
  this->field_0x28 = (this->field_0x28 & 0xf8) + 1;
  this->numDeletedProperties = '\0';
  this->nextPropertyIndex = 0;
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  local_58 = (undefined1  [8])
             &JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9ee0091;
  data.filename._0_4_ = 0x112;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
  this_00 = (BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,alloc,0x387914);
  capacity = (this->super_DynamicTypeHandler).slotCapacity;
  (this_00->buckets).ptr = (int *)0x0;
  (this_00->entries).ptr =
       (Entry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
        *)0x0;
  this_00->alloc = recycler;
  this_00->size = 0;
  this_00->bucketCount = 0;
  this_00->count = 0;
  this_00->freeCount = 0;
  this_00->modFunctionIndex = 0x4b;
  this_00->stats = (Type)0x0;
  if (0 < capacity) {
    JsUtil::
    BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
    ::Initialize(this_00,capacity);
  }
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = this_00;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SimpleDictionaryTypeHandlerBase(Recycler* recycler) :
        // We can do slotCapacity roundup here because this constructor is always creating type handler for a new object.
        DynamicTypeHandler(1),
        nextPropertyIndex(0),
        singletonInstance(nullptr),
        _gc_tag(true),
        isUnordered(false),
        hasNamelessPropertyId(false),
        numDeletedProperties(0)
    {
        SetIsInlineSlotCapacityLocked();
        propertyMap = RecyclerNew(recycler, SimplePropertyDescriptorMap, recycler, this->GetSlotCapacity());
    }